

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

string * __thiscall
el::base::utils::OS::getBashOutput_abi_cxx11_(string *__return_storage_ptr__,OS *this,char *command)

{
  FILE *__stream;
  char *pcVar1;
  allocator local_1031;
  undefined8 local_1030;
  size_t buffLen;
  char hBuff [4096];
  FILE *proc;
  char *command_local;
  
  if (this == (OS *)0x0) {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    __stream = popen((char *)this,"r");
    if (__stream == (FILE *)0x0) {
      ::std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    else {
      pcVar1 = fgets((char *)&buffLen,0x1000,__stream);
      if (pcVar1 == (char *)0x0) {
        pclose(__stream);
        ::std::__cxx11::string::string((string *)__return_storage_ptr__);
      }
      else {
        pclose(__stream);
        local_1030 = strlen((char *)&buffLen);
        if ((local_1030 != 0) && (*(char *)((long)&local_1030 + local_1030 + 7) == '\n')) {
          *(undefined1 *)((long)&local_1030 + local_1030 + 7) = 0;
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,(char *)&buffLen,&local_1031);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_1031);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const std::string OS::getBashOutput(const char* command) {
#if (ELPP_OS_UNIX && !ELPP_OS_ANDROID && !ELPP_CYGWIN)
  if (command == nullptr) {
    return std::string();
  }
  FILE* proc = nullptr;
  if ((proc = popen(command, "r")) == nullptr) {
    ELPP_INTERNAL_ERROR("\nUnable to run command [" << command << "]", true);
    return std::string();
  }
  char hBuff[4096];
  if (fgets(hBuff, sizeof(hBuff), proc) != nullptr) {
    pclose(proc);
    const std::size_t buffLen = strlen(hBuff);
    if (buffLen > 0 && hBuff[buffLen - 1] == '\n') {
      hBuff[buffLen - 1] = '\0';
    }
    return std::string(hBuff);
  } else {
    pclose(proc);
  }
  return std::string();
#else
  ELPP_UNUSED(command);
  return std::string();
#endif  // (ELPP_OS_UNIX && !ELPP_OS_ANDROID && !ELPP_CYGWIN)
}